

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O2

int __thiscall
glcts::CoherentBlendTestCaseGroup::init(CoherentBlendTestCaseGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  CoherentBlendTest *pCVar1;
  
  pCVar1 = (CoherentBlendTest *)operator_new(0x90);
  CoherentBlendTest::CoherentBlendTest
            (pCVar1,(this->super_TestCaseGroup).m_context,"mixedSequence",this->m_glslVersion,4,0xb,
             (BlendStep *)s_mixed);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (CoherentBlendTest *)operator_new(0x90);
  CoherentBlendTest::CoherentBlendTest
            (pCVar1,(this->super_TestCaseGroup).m_context,"multiplySequence",this->m_glslVersion,1,7
             ,(BlendStep *)s_multiply);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  return extraout_EAX;
}

Assistant:

void init(void)
	{
		addChild(
			new CoherentBlendTest(m_context, "mixedSequence", m_glslVersion, 4, DE_LENGTH_OF_ARRAY(s_mixed), s_mixed));
		addChild(new CoherentBlendTest(m_context, "multiplySequence", m_glslVersion, 1, DE_LENGTH_OF_ARRAY(s_multiply),
									   s_multiply));
	}